

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::reserve
          (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *this,
          size_t n)

{
  ShapeHandle *pSVar1;
  iterator pSVar2;
  ulong in_RSI;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *in_RDI;
  int i;
  ShapeHandle *ra;
  ShapeHandle *in_stack_ffffffffffffffc8;
  polymorphic_allocator<pbrt::ShapeHandle> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  if (in_RDI->nAlloc < in_RSI) {
    pSVar1 = pmr::polymorphic_allocator<pbrt::ShapeHandle>::allocate_object<pbrt::ShapeHandle>
                       (in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 = (polymorphic_allocator<pbrt::ShapeHandle> *)(pSVar1 + local_1c);
      begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::ShapeHandle>::construct<pbrt::ShapeHandle,pbrt::ShapeHandle>
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(ShapeHandle *)0x485f72);
      pSVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::ShapeHandle>::destroy<pbrt::ShapeHandle>
                (&in_RDI->alloc,pSVar2 + local_1c);
    }
    pmr::polymorphic_allocator<pbrt::ShapeHandle>::deallocate_object<pbrt::ShapeHandle>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x485fb4);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = pSVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }